

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

void __thiscall Qclass_execute_Test::TestBody(Qclass_execute_Test *this)

{
  bool bVar1;
  char *message;
  AssertHelper AStack_16000;
  Message MStack_15ff8;
  int iStack_15ff0;
  int iStack_15fec;
  undefined1 auStack_15fe8 [8];
  AssertionResult gtest_ar;
  undefined1 auStack_15fc8 [8];
  Qclass Test;
  Qclass_execute_Test *this_local;
  
  Qclass::Qclass((Qclass *)auStack_15fc8);
  Qclass::Train((Qclass *)auStack_15fc8);
  iStack_15fec = Qclass::execute((Qclass *)auStack_15fc8);
  iStack_15ff0 = 0;
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)auStack_15fe8,"Test.execute()","0",&iStack_15fec,&iStack_15ff0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)auStack_15fe8);
  if (!bVar1) {
    testing::Message::Message(&MStack_15ff8);
    message = testing::AssertionResult::failure_message((AssertionResult *)auStack_15fe8);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_16000,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/sudrag[P]Q-learning-for-2D-Occupancy-Grid/test/test.cpp"
               ,0x3e,message);
    testing::internal::AssertHelper::operator=(&AStack_16000,&MStack_15ff8);
    testing::internal::AssertHelper::~AssertHelper(&AStack_16000);
    testing::Message::~Message(&MStack_15ff8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)auStack_15fe8);
  Qclass::~Qclass((Qclass *)auStack_15fc8);
  return;
}

Assistant:

TEST(Qclass, execute) {
  Qclass Test;
  Test.Train();
  EXPECT_EQ(Test.execute(), 0);
}